

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel.cpp
# Opt level: O0

void __thiscall ncnn::Mat::to_pixels(Mat *this,uchar *pixels,int type,int stride)

{
  uint in_EDX;
  int unaff_retaddr;
  uchar *in_stack_00000008;
  int in_stack_00000104;
  uchar *in_stack_00000108;
  Mat *in_stack_00000110;
  int in_stack_00000124;
  uchar *in_stack_00000128;
  Mat *in_stack_00000130;
  int in_stack_00000154;
  uchar *in_stack_00000158;
  Mat *in_stack_00000160;
  
  if ((in_EDX & 0xffff0000) == 0) {
    if ((in_EDX == 1) || (in_EDX == 2)) {
      to_rgb(in_stack_00000110,in_stack_00000108,in_stack_00000104);
    }
    if (in_EDX == 3) {
      to_gray((Mat *)CONCAT44(type,stride),in_stack_00000008,unaff_retaddr);
    }
    if ((in_EDX != 4) && (in_EDX != 5)) {
      return;
    }
    to_rgba(in_stack_00000160,in_stack_00000158,in_stack_00000154);
    return;
  }
  if ((in_EDX == 0x10002) || (in_EDX == 0x20001)) {
    to_bgr2rgb(in_stack_00000130,in_stack_00000128,in_stack_00000124);
    return;
  }
  if (in_EDX == 0x40001) {
LAB_001203cd:
    to_rgb2rgba(in_stack_00000110,in_stack_00000108,in_stack_00000104);
    return;
  }
  if (in_EDX == 0x40002) {
LAB_001203e2:
    to_bgr2rgba(in_stack_00000110,in_stack_00000108,in_stack_00000104);
  }
  else {
    if (in_EDX == 0x40003) {
LAB_001203f7:
      to_gray2rgba((Mat *)CONCAT44(type,stride),in_stack_00000008,unaff_retaddr);
      return;
    }
    if (in_EDX != 0x40005) {
      if (in_EDX == 0x50001) goto LAB_001203e2;
      if (in_EDX == 0x50002) goto LAB_001203cd;
      if (in_EDX == 0x50003) goto LAB_001203f7;
      if (in_EDX != 0x50004) {
        return;
      }
    }
    to_rgba2bgra(in_stack_00000160,in_stack_00000158,in_stack_00000154);
  }
  return;
}

Assistant:

void Mat::to_pixels(unsigned char* pixels, int type, int stride) const
{
    if (type & PIXEL_CONVERT_MASK)
    {
        switch (type)
        {
        case PIXEL_RGB2BGR:
        case PIXEL_BGR2RGB:
            to_bgr2rgb(*this, pixels, stride);
            break;
        case PIXEL_RGB2RGBA:
        case PIXEL_BGR2BGRA:
            to_rgb2rgba(*this, pixels, stride);
            break;
        case PIXEL_BGR2RGBA:
        case PIXEL_RGB2BGRA:
            to_bgr2rgba(*this, pixels, stride);
            break;
        case PIXEL_GRAY2RGBA:
        case PIXEL_GRAY2BGRA:
            to_gray2rgba(*this, pixels, stride);
            break;
        case PIXEL_RGBA2BGRA:
        case PIXEL_BGRA2RGBA:
            to_rgba2bgra(*this, pixels, stride);
            break;
        default:
            // unimplemented convert type
            break;
        }
    }
    else
    {
        if (type == PIXEL_RGB || type == PIXEL_BGR)
            to_rgb(*this, pixels, stride);

        if (type == PIXEL_GRAY)
            to_gray(*this, pixels, stride);

        if (type == PIXEL_RGBA || type == PIXEL_BGRA)
            to_rgba(*this, pixels, stride);
    }
}